

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *s,QRegion *r)

{
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  ByteOrder unaff_retaddr;
  int unaff_retaddr_00;
  QByteArray *in_stack_00000008;
  QRegion *in_stack_00000010;
  QByteArray b;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x650bda);
  operator>>(in_RDI,(QByteArray *)&local_28);
  QDataStream::version(in_RDI);
  QDataStream::byteOrder(in_RDI);
  QRegion::exec(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  QByteArray::~QByteArray((QByteArray *)0x650c32);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QRegion &r)
{
    QByteArray b;
    s >> b;
    r.exec(b, s.version(), s.byteOrder());
    return s;
}